

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::construct_msgs(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                 *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1,
                vector<unsigned_long,_std::allocator<unsigned_long>_> *param_2,int dist)

{
  pointer *ppmVar1;
  pointer *this_00;
  allocator<int> *this_01;
  value_type vVar2;
  anon_class_64_8_0d7252e9 f;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  MPI_Comm poVar7;
  reference pvVar8;
  size_type sVar9;
  reference puVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  ostream *poVar13;
  void *pvVar14;
  iterator iVar15;
  iterator iVar16;
  pointer puVar17;
  iterator __first;
  iterator __last;
  pointer pTVar18;
  reference pvVar19;
  pointer pmVar20;
  bool local_5a9;
  bool local_599;
  byte local_519;
  bool local_449;
  allocator local_411;
  string local_410 [32];
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_3f0;
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_3e8;
  iterator it_4;
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_3d8;
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_3d0;
  iterator it_3;
  unsigned_long i_3;
  unsigned_long j_2;
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_3b0;
  iterator it_2;
  size_t local_368;
  size_t rebucket_offset;
  size_t bucket_offset;
  undefined1 local_350 [3];
  bool participate;
  int left_p;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> border_bucket;
  int phase_1;
  int i_2;
  int phase;
  vector<int,_std::allocator<int>_> schedule;
  undefined1 local_308 [8];
  vector<int,_std::allocator<int>_> overlaps;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  _Stack_2e8;
  int my_schedule;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_2e0;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_2d8;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_2d0;
  iterator it_1;
  size_t out_idx;
  unsigned_long cur_b;
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_2a8;
  mypair<unsigned_long> *local_2a0;
  undefined1 local_298 [8];
  TwoBSA<unsigned_long> tuple;
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_278;
  size_t local_270;
  size_t right_bucket_offset;
  size_t first_bucket_begin;
  size_t bucket_begin;
  iterator iStack_250;
  int overlap_type;
  iterator msgit;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  minqueries;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> right_bucket;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> left_bucket;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> bucket;
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_1b8;
  const_iterator local_1b0;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  *local_1a8;
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_1a0;
  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
  local_198;
  iterator it;
  int local_184;
  size_t gl_unfinished;
  size_t gl_unresolved;
  unsigned_long local_168;
  value_type local_160;
  unsigned_long local_150;
  size_t i_1;
  unsigned_long j_1;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  size_t unfinished_b;
  size_t unresolved_els;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> out_of_bounds_msgs;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> msgs;
  unsigned_long shift_by;
  string local_d8 [6];
  bool right_bucket_crosses_proc;
  long local_b8;
  size_t i;
  size_t j;
  vector<unsigned_long,_std::allocator<unsigned_long>_> active_elements;
  size_t prefix;
  undefined1 *local_78;
  unsigned_long right_B;
  section_timer timer;
  int dist_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_ISA_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_B_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  *this_local;
  
  timer.start.__d.__r._4_4_ = dist;
  poVar7 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                     &right_B,(ostream *)&std::cerr,poVar7,0);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_1,0);
  local_78 = (undefined1 *)mxx::left_shift<unsigned_long>(pvVar8,&this->comm);
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)mxx::partition::block_decomposition_buffered<unsigned_long>::excl_prefix_size
                          (&this->part);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j);
  for (i = 0; sVar3 = i,
      sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(param_1),
      sVar3 < sVar9; i = i + 1) {
    local_b8 = (long)active_elements.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + i;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_1,i);
    if ((*pvVar8 != local_b8 + 1U) ||
       ((pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_1,i),
        *pvVar8 == local_b8 + 1U &&
        (((i < this->local_size - 1 &&
          (pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (param_1,i + 1), *pvVar8 == local_b8 + 1U)) ||
         ((i == this->local_size - 1 &&
          ((iVar6 = mxx::comm::rank(&this->comm), iVar6 < this->p + -1 &&
           (local_78 == (undefined1 *)(local_b8 + 1U))))))))))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j,&i);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"get active elements",(allocator *)((long)&shift_by + 7));
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)&right_B,
             (string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&shift_by + 7));
  iVar6 = mxx::comm::rank(&this->comm);
  local_449 = false;
  if (iVar6 < this->p + -1) {
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(param_1);
    local_449 = (undefined1 *)*pvVar8 == local_78;
  }
  shift_by._6_1_ = local_449;
  for (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(long)timer.start.__d.__r._4_4_;
      msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)this->n;
      msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)msgs.
                           super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage << 1)) {
    std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::vector
              ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
               &out_of_bounds_msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::vector
              ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
               &unresolved_els);
    unfinished_b = 0;
    __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j);
    j_1 = (unsigned_long)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&j_1), bVar4) {
      puVar10 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&__end0);
      i_1 = *puVar10;
      local_150 = (long)active_elements.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + i_1;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_SA,i_1);
      if ((long)&(msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + *pvVar8 < this->n) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->local_SA,i_1);
        gl_unresolved =
             (long)&(msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + *pvVar8;
        local_168 = local_150;
        std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::push_back
                  ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                   &out_of_bounds_msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&gl_unresolved)
        ;
      }
      else {
        local_160.first = 0;
        local_160.second = local_150;
        std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::push_back
                  ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                   &unresolved_els,&local_160);
      }
      unfinished_b = unfinished_b + 1;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_1,i_1);
      if (*pvVar8 == local_150 + 1) {
        __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(__range3->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end0);
    }
    uVar11 = mxx::allreduce<unsigned_long>(&unfinished_b,&this->comm);
    uVar12 = mxx::allreduce<unsigned_long>((unsigned_long *)&__range3,&this->comm);
    iVar6 = mxx::comm::rank(&this->comm);
    if (iVar6 == 0) {
      poVar13 = std::operator<<((ostream *)&std::cerr,"==== chaising iteration ");
      poVar13 = (ostream *)
                std::ostream::operator<<
                          (poVar13,(ulong)msgs.
                                          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar13 = std::operator<<(poVar13," unresolved = ");
      pvVar14 = (void *)std::ostream::operator<<(poVar13,uVar11);
      std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
      poVar13 = std::operator<<((ostream *)&std::cerr,"==== chaising iteration ");
      poVar13 = (ostream *)
                std::ostream::operator<<
                          (poVar13,(ulong)msgs.
                                          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar13 = std::operator<<(poVar13," unfinished = ");
      pvVar14 = (void *)std::ostream::operator<<(poVar13,uVar12);
      std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
    }
    if (uVar11 == 0) {
      local_184 = 5;
    }
    else {
      it._M_current = (mypair<unsigned_long> *)this;
      mxx::
      all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_1_>
                ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                 &out_of_bounds_msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(anon_class_8_1_8991fb9c)this,
                 &this->comm);
      local_198._M_current =
           (mypair<unsigned_long> *)
           std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::begin
                     ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                      &out_of_bounds_msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        local_1a0._M_current =
             (mypair<unsigned_long> *)
             std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::end
                       ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                        &out_of_bounds_msgs.
                         super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar4 = __gnu_cxx::operator!=(&local_198,&local_1a0);
        if (!bVar4) break;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_198);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_2,pmVar20->first -
                                    (long)active_elements.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        vVar2 = *pvVar8;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_198);
        pmVar20->first = vVar2;
        __gnu_cxx::
        __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
        ::operator++(&local_198);
      }
      local_1a8 = this;
      mxx::
      all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_2_>
                ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                 &out_of_bounds_msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(anon_class_8_1_8991fb9c)this,
                 &this->comm);
      sVar9 = std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::size
                        ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                         &unresolved_els);
      if (sVar9 != 0) {
        ppmVar1 = &out_of_bounds_msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1b8._M_current =
             (mypair<unsigned_long> *)
             std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::end
                       ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                        ppmVar1);
        __gnu_cxx::
        __normal_iterator<mypair<unsigned_long>const*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>
        ::__normal_iterator<mypair<unsigned_long>*>
                  ((__normal_iterator<mypair<unsigned_long>const*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>
                    *)&local_1b0,&local_1b8);
        iVar15 = std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::begin
                           ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                             *)&unresolved_els);
        iVar16 = std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::end
                           ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                             *)&unresolved_els);
        std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
        insert<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,void>
                  ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)ppmVar1,
                   local_1b0,
                   (__normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    )iVar15._M_current,
                   (__normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    )iVar16._M_current);
      }
      std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::clear
                ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                 &unresolved_els);
      sVar9 = std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::size
                        ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                         &out_of_bounds_msgs.
                          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar9 != unfinished_b) {
        __assert_fail("msgs.size() == unresolved_els",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x5be,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      ppmVar1 = &out_of_bounds_msgs.
                 super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar15 = std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::begin
                         ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                          ppmVar1);
      iVar16 = std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::end
                         ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                          ppmVar1);
      std::
      sort<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&,mypair<unsigned_long>const&)_1_>
                (iVar15._M_current,iVar16._M_current);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                 &left_bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                 &right_bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                 &minqueries.
                  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ::vector((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                *)&msgit);
      iStack_250 = std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::
                   begin((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                         &out_of_bounds_msgs.
                          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bucket_begin._4_4_ = 0;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_1,0);
      right_bucket_offset = *pvVar8 - 1;
      local_270 = 0;
      first_bucket_begin = right_bucket_offset;
      while( true ) {
        local_278._M_current =
             (mypair<unsigned_long> *)
             std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::end
                       ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                        &out_of_bounds_msgs.
                         super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar4 = __gnu_cxx::operator!=(&stack0xfffffffffffffdb0,&local_278);
        if (!bVar4) break;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&stack0xfffffffffffffdb0);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_1,pmVar20->second -
                                    (long)active_elements.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        puVar17 = (pointer)(*pvVar8 - 1);
        bVar4 = true;
        first_bucket_begin = (size_t)puVar17;
        if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage <= puVar17) {
          pmVar20 = __gnu_cxx::
                    __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    ::operator->(&stack0xfffffffffffffdb0);
          bVar4 = puVar17 == (pointer)pmVar20->second;
        }
        if (!bVar4) {
          __assert_fail("bucket_begin < prefix || bucket_begin == msgit->second",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                        ,0x5dc,
                        "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                       );
        }
        while( true ) {
          tuple.SA = (unsigned_long)
                     std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::
                     end((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                         &out_of_bounds_msgs.
                          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar5 = __gnu_cxx::operator!=
                            (&stack0xfffffffffffffdb0,
                             (__normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                              *)&tuple.SA);
          bVar4 = false;
          if (bVar5) {
            pmVar20 = __gnu_cxx::
                      __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                      ::operator->(&stack0xfffffffffffffdb0);
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (param_1,pmVar20->second -
                                        (long)active_elements.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar4 = *pvVar8 - 1 == first_bucket_begin;
          }
          if (!bVar4) break;
          pmVar20 = __gnu_cxx::
                    __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    ::operator->(&stack0xfffffffffffffdb0);
          bVar4 = false;
          if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage <= (pointer)pmVar20->second) {
            pmVar20 = __gnu_cxx::
                      __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                      ::operator->(&stack0xfffffffffffffdb0);
            bVar4 = pmVar20->second <
                    (long)active_elements.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + this->local_size;
          }
          if (!bVar4) {
            __assert_fail("msgit->second >= prefix && msgit->second < prefix+local_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x5e1,
                          "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                         );
          }
          pmVar20 = __gnu_cxx::
                    __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    ::operator->(&stack0xfffffffffffffdb0);
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->local_SA,
                              pmVar20->second -
                              (long)active_elements.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          tuple.B2 = *pvVar8;
          pmVar20 = __gnu_cxx::
                    __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    ::operator->(&stack0xfffffffffffffdb0);
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (param_1,pmVar20->second -
                                      (long)active_elements.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_298 = (undefined1  [8])*pvVar8;
          pmVar20 = __gnu_cxx::
                    __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    ::operator->(&stack0xfffffffffffffdb0);
          tuple.B1 = pmVar20->first;
          std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::push_back
                    ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                     &left_bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_298);
          local_2a0 = (mypair<unsigned_long> *)
                      __gnu_cxx::
                      __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                      ::operator++(&stack0xfffffffffffffdb0,0);
        }
        local_2a8._M_current =
             (mypair<unsigned_long> *)
             std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::end
                       ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                        &out_of_bounds_msgs.
                         super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar4 = __gnu_cxx::operator==(&stack0xfffffffffffffdb0,&local_2a8);
        local_519 = 0;
        if (bVar4) {
          local_519 = shift_by._6_1_;
        }
        if ((local_519 & 1) == 0) {
          if (first_bucket_begin <
              active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            bucket_begin._4_4_ = bucket_begin._4_4_ + 1;
            std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::swap
                      ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       &right_bucket.
                        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       &left_bucket.
                        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            this_00 = &left_bucket.
                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __first = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                      begin((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)this_00);
            __last = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                     end((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                         this_00);
            std::
            sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                      ((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                        )__first._M_current,
                       (__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                        )__last._M_current);
            out_idx = first_bucket_begin + 1;
            it_1._M_current =
                 (TwoBSA<unsigned_long> *)
                 (first_bucket_begin -
                 (long)active_elements.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
            bVar4 = true;
            if (it_1._M_current != (TwoBSA<unsigned_long> *)0x0) {
              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (param_1,(size_type)((long)&it_1._M_current[-1].SA + 7));
              bVar4 = *pvVar8 < out_idx;
            }
            if (!bVar4) {
              __assert_fail("out_idx == 0 || local_B[out_idx-1] < cur_b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x603,
                            "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                           );
            }
            local_2d0._M_current =
                 (TwoBSA<unsigned_long> *)
                 std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                           ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)&left_bucket.
                                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            while( true ) {
              local_2d8._M_current =
                   (TwoBSA<unsigned_long> *)
                   std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::end
                             ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                               *)&left_bucket.
                                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar4 = __gnu_cxx::operator!=(&local_2d0,&local_2d8);
              if (!bVar4) break;
              local_2e0._M_current =
                   (TwoBSA<unsigned_long> *)
                   std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
                   begin((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                         &left_bucket.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar5 = __gnu_cxx::operator!=(&local_2d0,&local_2e0);
              bVar4 = false;
              if (bVar5) {
                _Stack_2e8 = __gnu_cxx::
                             __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                             ::operator-(&local_2d0,1);
                pTVar18 = __gnu_cxx::
                          __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                          ::operator->(&stack0xfffffffffffffd18);
                uVar11 = pTVar18->B2;
                pTVar18 = __gnu_cxx::
                          __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                          ::operator->(&local_2d0);
                bVar4 = uVar11 != pTVar18->B2;
              }
              if (bVar4) {
                out_idx = (long)active_elements.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                          (long)((long)&(it_1._M_current)->B1 + 1);
              }
              pTVar18 = __gnu_cxx::
                        __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                        ::operator->(&local_2d0);
              uVar11 = pTVar18->SA;
              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&this->local_SA,(size_type)it_1._M_current);
              *pvVar8 = uVar11;
              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (param_1,(size_type)it_1._M_current);
              *pvVar8 = out_idx;
              it_1._M_current = (TwoBSA<unsigned_long> *)((long)&(it_1._M_current)->B1 + 1);
              __gnu_cxx::
              __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
              ::operator++(&local_2d0);
            }
            bVar4 = true;
            if (it_1._M_current != (TwoBSA<unsigned_long> *)this->local_size) {
              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (param_1,(size_type)it_1._M_current);
              bVar4 = *pvVar8 ==
                      (long)active_elements.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage +
                      (long)it_1._M_current + 1U;
            }
            if (!bVar4) {
              __assert_fail("out_idx == local_size || local_B[out_idx] == prefix+out_idx+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x620,
                            "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                           );
            }
          }
        }
        else {
          iVar6 = mxx::comm::rank(&this->comm);
          bVar4 = false;
          if (iVar6 < this->p + -1) {
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(param_1);
            bVar4 = (undefined1 *)*pvVar8 == local_78;
          }
          if (!bVar4) {
            __assert_fail("comm.rank() < p-1 && local_B.back() == right_B",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x5eb,
                          "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                         );
          }
          if (first_bucket_begin <
              active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::swap
                      ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       &right_bucket.
                        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       &left_bucket.
                        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bucket_begin._4_4_ = 4;
          }
          else {
            bucket_begin._4_4_ = bucket_begin._4_4_ + 2;
            std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::swap
                      ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       &minqueries.
                        super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       &left_bucket.
                        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_270 = first_bucket_begin -
                        (long)active_elements.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
        }
        std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::clear
                  ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                   &left_bucket.
                    super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      overlaps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = -1;
      iVar6 = mxx::comm::rank(&this->comm);
      if (iVar6 == 0) {
        iVar6 = this->p;
        this_01 = (allocator<int> *)
                  ((long)&schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<int>::allocator(this_01);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_308,(long)iVar6,this_01);
        std::allocator<int>::~allocator
                  ((allocator<int> *)
                   ((long)&schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_308,0);
        poVar7 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
        MPI_Gather((long)&bucket_begin + 4,1,&ompi_mpi_int,pvVar19,1,&ompi_mpi_int,0,poVar7);
        iVar6 = this->p;
        std::allocator<int>::allocator((allocator<int> *)((long)&i_2 + 3));
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&phase,(long)iVar6,
                   (allocator<int> *)((long)&i_2 + 3));
        std::allocator<int>::~allocator((allocator<int> *)((long)&i_2 + 3));
        phase_1 = 0;
        for (border_bucket.
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            border_bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < this->p;
            border_bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 border_bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_308,
                               (long)border_bucket.
                                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          switch(*pvVar19) {
          case 0:
            pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)&phase,
                                 (long)border_bucket.
                                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            *pvVar19 = -1;
            break;
          case 1:
            pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)&phase,
                                 (long)border_bucket.
                                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            *pvVar19 = phase_1;
            break;
          case 2:
            phase_1 = 0;
            pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)&phase,
                                 (long)border_bucket.
                                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            *pvVar19 = 0;
            break;
          case 3:
            pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)&phase,
                                 (long)border_bucket.
                                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            *pvVar19 = phase_1;
            phase_1 = 1 - phase_1;
            break;
          case 4:
            pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)&phase,
                                 (long)border_bucket.
                                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            *pvVar19 = phase_1;
            break;
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x64d,
                          "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                         );
          }
        }
        pvVar19 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&phase,0);
        poVar7 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
        MPI_Scatter(pvVar19,1,&ompi_mpi_int,
                    (undefined1 *)
                    ((long)&overlaps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),1,&ompi_mpi_int,0,poVar7)
        ;
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&phase)
        ;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_308);
      }
      else {
        poVar7 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
        MPI_Gather((long)&bucket_begin + 4,1,&ompi_mpi_int,0,1,&ompi_mpi_int,0,poVar7);
        poVar7 = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
        MPI_Scatter(0,1,&ompi_mpi_int,
                    (undefined1 *)
                    ((long)&overlaps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),1,&ompi_mpi_int,0,poVar7)
        ;
      }
      for (border_bucket.
           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (int)border_bucket.
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage < 2;
          border_bucket.
          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)border_bucket.
                    super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
                  ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                   local_350,
                   (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                   &right_bucket.
                    super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bucket_offset._4_4_ =
             mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                       (&this->part,right_bucket_offset);
        local_599 = bucket_begin._4_4_ != 0 &&
                    overlaps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ ==
                    (int)border_bucket.
                         super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
        bucket_offset._3_1_ = local_599;
        rebucket_offset = 0;
        local_368 = right_bucket_offset;
        if (((overlaps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage._4_4_ !=
              (int)border_bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) && (bucket_begin._4_4_ == 3))
           || ((overlaps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ ==
                (int)border_bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage && (bucket_begin._4_4_ == 2)
               ))) {
          std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator=
                    ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                     local_350,
                     (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                     &minqueries.
                      super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bucket_offset._4_4_ = mxx::comm::rank(&this->comm);
          bucket_offset._3_1_ = true;
          rebucket_offset = local_270;
          local_368 = (long)active_elements.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + local_270;
        }
        it_2._M_current = (mypair<unsigned_long> *)((long)&bucket_offset + 4);
        f.border_bucket =
             (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_350;
        f.left_p = (int *)it_2._M_current;
        f.this = this;
        f.rebucket_offset = &local_368;
        f.minqueries = (vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                        *)&msgit;
        f.bucket_offset = &rebucket_offset;
        f.local_B = param_1;
        f.prefix = (size_t *)
                   &active_elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        mxx::comm::
        with_subset<suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mxx::comm_const&)_1_>
                  (&this->comm,(bool)bucket_offset._3_1_,f);
        mxx::comm::barrier(&this->comm);
        std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
                  ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                   local_350);
      }
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_1,0);
      local_78 = (undefined1 *)mxx::left_shift<unsigned_long>(pvVar8,&this->comm);
      iVar6 = mxx::comm::rank(&this->comm);
      local_5a9 = false;
      if (iVar6 < this->p + -1) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(param_1);
        local_5a9 = (undefined1 *)*pvVar8 == local_78;
      }
      shift_by._6_1_ = local_5a9;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j);
      local_3b0._M_current =
           (mypair<unsigned_long> *)
           std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::begin
                     ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                      &out_of_bounds_msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        j_2 = (unsigned_long)
              std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::end
                        ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                         &out_of_bounds_msgs.
                          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar4 = __gnu_cxx::operator!=
                          (&local_3b0,
                           (__normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                            *)&j_2);
        if (!bVar4) break;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_3b0);
        i_3 = pmVar20->second -
              (long)active_elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_3b0);
        it_3._M_current = (mypair<unsigned_long> *)pmVar20->second;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_1,i_3)
        ;
        if (((undefined1 *)*pvVar8 != (undefined1 *)((long)&(it_3._M_current)->first + 1U)) ||
           ((pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (param_1,i_3),
            (undefined1 *)*pvVar8 == (undefined1 *)((long)&(it_3._M_current)->first + 1U) &&
            (((i_3 < this->local_size - 1 &&
              (pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (param_1,i_3 + 1),
              (undefined1 *)*pvVar8 == (undefined1 *)((long)&(it_3._M_current)->first + 1U))) ||
             ((i_3 == this->local_size - 1 &&
              ((iVar6 = mxx::comm::rank(&this->comm), iVar6 < this->p + -1 &&
               (local_78 == (undefined1 *)((long)&(it_3._M_current)->first + 1U))))))))))) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j,&i_3);
        }
        __gnu_cxx::
        __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
        ::operator++(&local_3b0);
      }
      local_3d0._M_current =
           (mypair<unsigned_long> *)
           std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::begin
                     ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                      &out_of_bounds_msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        local_3d8._M_current =
             (mypair<unsigned_long> *)
             std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::end
                       ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                        &out_of_bounds_msgs.
                         super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar4 = __gnu_cxx::operator!=(&local_3d0,&local_3d8);
        if (!bVar4) break;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_3d0);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->local_SA,
                            pmVar20->second -
                            (long)active_elements.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        vVar2 = *pvVar8;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_3d0);
        pmVar20->first = vVar2;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_3d0);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_1,pmVar20->second -
                                    (long)active_elements.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        vVar2 = *pvVar8;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_3d0);
        pmVar20->second = vVar2;
        __gnu_cxx::
        __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
        ::operator++(&local_3d0);
      }
      it_4._M_current = (mypair<unsigned_long> *)this;
      mxx::
      all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_3_>
                ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                 &out_of_bounds_msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(anon_class_8_1_8991fb9c)this,
                 &this->comm);
      local_3e8._M_current =
           (mypair<unsigned_long> *)
           std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::begin
                     ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                      &out_of_bounds_msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        local_3f0._M_current =
             (mypair<unsigned_long> *)
             std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::end
                       ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
                        &out_of_bounds_msgs.
                         super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar4 = __gnu_cxx::operator!=(&local_3e8,&local_3f0);
        if (!bVar4) break;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_3e8);
        uVar11 = pmVar20->second;
        pmVar20 = __gnu_cxx::
                  __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                  ::operator->(&local_3e8);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_2,pmVar20->first -
                                    (long)active_elements.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *pvVar8 = uVar11;
        __gnu_cxx::
        __normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
        ::operator++(&local_3e8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_410,"bucket-chaising iteration",&local_411);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                 &right_B,(string *)local_410);
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      std::
      vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ::~vector((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                 *)&msgit);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                 &minqueries.
                  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                 &right_bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                 &left_bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_184 = 0;
    }
    std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::~vector
              ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
               &unresolved_els);
    std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::~vector
              ((vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> *)
               &out_of_bounds_msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_184 != 0) break;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&j);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  ~section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                      &right_B);
  return;
}

Assistant:

void construct_msgs(std::vector<index_t>& local_B, std::vector<index_t>& local_ISA, int dist)
{
    /*
     * Algorithm for few remaining buckets (more communication overhead per
     * element but sends only unfinished buckets -> less data in total if few
     * buckets remaining)
     *
     * INPUT:
     *  - SA in SA order
     *  - B in SA order
     *  - ISA in ISA order (<=> B in ISA order)
     *  - dist: the current dist=2^k, gets doubled after every iteration
     *
     * ALGO:
     * 1.) on i:            send tuple (`to:` Sa[i]+2^k, `from:` i)
     * 2.) on SA[i]+2^k:    return tuple (`to:` i, ISA[SA[i]+2^k])
     * 3.) on i:            for each unfinished bucket:
     *                          sort by new bucket index (2-stage across
     *                          processor boundaries using MPI subcommunicators)
     *                          rebucket into `B`
     * 4.) on i:            send tuple (`to:` SA[i], B[i]) // update bucket numbers in ISA order
     * 5.) on SA[i]:        update ISA[SA[i]] to new B[i]
     *
     */

    SAC_TIMER_START();


    /*
     * 0.) Preparation: need unfinished buckets (info accross proc. boundaries)
     */
    // get next element from right
    index_t right_B = mxx::left_shift(local_B[0], comm);

    // get global offset
    const std::size_t prefix = part.excl_prefix_size();

    // get active elements
    std::vector<index_t> active_elements;
    for (std::size_t j = 0; j < local_B.size(); ++j) {
        // get global index for each local index
        std::size_t i =  prefix + j;
        // check if this is a unresolved bucket
        // relying on the property that for resolved buckets:
        //   B[i] == i+1 and B[i+1] == i+2
        //   (where `i' is the global index)
        if (local_B[j] != i+1 || (local_B[j] == i+1
                    && ((j < local_size-1 && local_B[j+1] == i+1)
                        || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
        {
            // save local active indexes
            active_elements.push_back(j);
        }
    }
    SAC_TIMER_END_SECTION("get active elements");

    bool right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

    for (index_t shift_by = dist; shift_by < n; shift_by <<= 1) {
        /*
         * 1.) on i: send tuple (`to:` Sa[i]+2^k, `from:` i)
         */
        //std::vector<std::pair<index_t, index_t> > msgs;
        //std::vector<std::pair<index_t, index_t> > out_of_bounds_msgs;
        std::vector<mypair<index_t> > msgs;
        std::vector<mypair<index_t> > out_of_bounds_msgs;
        // linear scan for bucket boundaries
        // and create tuples/pairs
        std::size_t unresolved_els = 0;
        std::size_t unfinished_b = 0;
        for (index_t j : active_elements) {
            // get global index for each local index
            std::size_t i =  prefix + j;
            // add tuple
            if (local_SA[j] + shift_by >= n)
                //out_of_bounds_msgs.push_back(std::make_pair<index_t,index_t>(0, static_cast<index_t>(i)));
                out_of_bounds_msgs.push_back({0, static_cast<index_t>(i)});
            else
                //msgs.push_back(std::make_pair<index_t,index_t>(local_SA[j]+shift_by, static_cast<index_t>(i)));
                msgs.push_back({local_SA[j]+shift_by, static_cast<index_t>(i)});
            unresolved_els++;
            if (local_B[j] == i+1) // if first element of unfinished bucket:
                unfinished_b++;
        }

        // check if all resolved
        std::size_t gl_unresolved = mxx::allreduce(unresolved_els, comm);
        std::size_t gl_unfinished = mxx::allreduce(unfinished_b, comm);
        if (comm.rank() == 0) {
            INFO("==== chaising iteration " << shift_by << " unresolved = " << gl_unresolved);
            INFO("==== chaising iteration " << shift_by << " unfinished = " << gl_unfinished);
        }
        if (gl_unresolved == 0)
            // finished!
            break;

        // message exchange to processor which contains first index
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.first);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // for each message, add the bucket no. into the `first` field
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_ISA[it->first - prefix];
        }


        /*
         * 2.)
         */
        // send messages back to originator
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.second);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.second);}, comm);

        // append the previous out-of-bounds messages (since they all have B2 = 0)
        if (out_of_bounds_msgs.size() > 0)
            msgs.insert(msgs.end(), out_of_bounds_msgs.begin(), out_of_bounds_msgs.end());
        out_of_bounds_msgs.clear();

        assert(msgs.size() == unresolved_els);

        // sort received messages by the target index to enable consecutive
        // scanning of local buckets and messages
        std::sort(msgs.begin(), msgs.end(), [](const mypair<index_t>& x, const mypair<index_t>& y){ return x.second < y.second;});

        /*
         * 3.)
         */
        // building sequence of triplets for each unfinished bucket and sort
        // then rebucket, buckets which spread accross boundaries, sort via
        // MPI sub communicators and samplesort in two phases
        std::vector<TwoBSA<index_t> > bucket;
        std::vector<TwoBSA<index_t> > left_bucket;
        std::vector<TwoBSA<index_t> > right_bucket;

        // prepare LCP queries vector
        std::vector<std::tuple<index_t, index_t, index_t> > minqueries;

        // find bucket boundaries:
        auto msgit = msgs.begin();
        // overlap type:    0: no overlaps, 1: left overlap, 2:right overlap,
        //                  3: separate overlaps on left and right
        //                  4: contiguous overlap with both sides
        int overlap_type = 0; // init to no overlaps
        std::size_t bucket_begin = local_B[0]-1;
        std::size_t first_bucket_begin = bucket_begin;
        std::size_t right_bucket_offset = 0;
        while (msgit != msgs.end()) {
            bucket_begin = local_B[msgit->second - prefix]-1;
            assert(bucket_begin < prefix || bucket_begin == msgit->second);

            // find end of bucket
            while (msgit != msgs.end() && local_B[msgit->second - prefix]-1 == bucket_begin) {
                TwoBSA<index_t> tuple;
                assert(msgit->second >= prefix && msgit->second < prefix+local_size);
                tuple.SA = local_SA[msgit->second - prefix];
                tuple.B1 = local_B[msgit->second - prefix];
                tuple.B2 = msgit->first;
                bucket.push_back(tuple);
                msgit++;
            }

            // get bucket end (could be on other processor)
            if (msgit == msgs.end() && right_bucket_crosses_proc) {
                assert(comm.rank() < p-1 && local_B.back() == right_B);
                if (bucket_begin >= prefix)
                {
                    overlap_type += 2;
                    right_bucket.swap(bucket);
                    right_bucket_offset = bucket_begin - prefix;
                }
                else
                {
                    // bucket extends to left AND right
                    left_bucket.swap(bucket);
                    overlap_type = 4;
                }
            } else {
                if (bucket_begin >= prefix)
                {
                    // this is a local bucket => sort by B2, rebucket, and save
                    // TODO custom comparison that only sorts by B2, not by B1 as well
                    std::sort(bucket.begin(), bucket.end());
                    // local rebucket
                    // save back into local_B, local_SA, etc
                    index_t cur_b = bucket_begin + 1;
                    std::size_t out_idx = bucket_begin - prefix;
                    // assert previous bucket index is smaller
                    assert(out_idx == 0 || local_B[out_idx-1] < cur_b);
                    for (auto it = bucket.begin(); it != bucket.end(); ++it)
                    {
                        // if this is a new bucket, then update number
                        if (it != bucket.begin() && (it-1)->B2 != it->B2)
                        {
                            // update bucket index
                            cur_b = out_idx + prefix + 1;

                            if (_CONSTRUCT_LCP)
                            {
                                // add as query item for LCP construction
                                index_t left_b  = std::min((it-1)->B2, it->B2);
                                index_t right_b = std::max((it-1)->B2, it->B2);
                                // we need the minumum LCP of all suffixes in buckets between
                                // these two buckets. Since the first element in the left bucket
                                // is the LCP of this bucket with its left bucket and we don't need
                                // this LCP value, start one to the right:
                                // (-1 each since buffer numbers are current index + 1)
                                index_t range_left = (left_b-1) + 1;
                                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                                minqueries.emplace_back(out_idx + prefix, range_left, range_right);
                            }
                        }
                        local_SA[out_idx] = it->SA;
                        local_B[out_idx] = cur_b;
                        out_idx++;
                    }
                    // assert next bucket index is larger
                    assert(out_idx == local_size || local_B[out_idx] == prefix+out_idx+1);
                }
                else
                {
                    overlap_type += 1;
                    left_bucket.swap(bucket);
                }
            }
            bucket.clear();
        }

        // if we have left/right/both/or double buckets, do global comm in two phases
        int my_schedule = -1;
        if (comm.rank() == 0) {
            // gather all types to first processor
            std::vector<int> overlaps(p);
            MPI_Gather(&overlap_type, 1, MPI_INT, &overlaps[0], 1, MPI_INT, 0, comm);

            // create schedule using linear scan over the overlap types
            std::vector<int> schedule(p);
            int phase = 0; // start in first phase
            for (int i = 0; i < p; ++i) {
                switch (overlaps[i]) {
                    case 0:
                        schedule[i] = -1; // doesn't matter
                        break;
                    case 1:
                        // only left overlap -> participate in current phase
                        schedule[i] = phase;
                        break;
                    case 2:
                        // only right overlap, start with phase 0
                        phase = 0;
                        schedule[i] = phase;
                        break;
                    case 3:
                        // separate overlaps left and right -> switch phase
                        schedule[i] = phase; // left overlap starts with current phase
                        phase = 1 - phase;
                        break;
                    case 4:
                        // overlap with both: left and right => keep phase
                        schedule[i] = phase;
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            // scatter the schedule to the processors
            MPI_Scatter(&schedule[0], 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        } else {
            // send out my overlap type
            MPI_Gather(&overlap_type, 1, MPI_INT, NULL, 1, MPI_INT, 0, comm);

            // ... let master processor solve the schedule

            // receive schedule:
            MPI_Scatter(NULL, 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        }


        // two phase sorting across boundaries using sub communicators
        for (int phase = 0; phase <= 1; ++phase) {
            std::vector<TwoBSA<index_t> > border_bucket = left_bucket;
            // the leftmost processor of a group will be used as split
            int left_p = part.target_processor(first_bucket_begin);
            bool participate = (overlap_type != 0 && my_schedule == phase);
            std::size_t bucket_offset = 0; // left bucket starts from beginning
            std::size_t rebucket_offset = first_bucket_begin;
            if ((my_schedule != phase && overlap_type == 3) || (my_schedule == phase && overlap_type == 2)) {
                // starting a bucket at the end
                border_bucket = right_bucket;
                left_p = comm.rank();
                participate = true;
                bucket_offset = right_bucket_offset;
                rebucket_offset = prefix + bucket_offset;
            }

            comm.with_subset(participate,[&](const mxx::comm& sc) {
                // split communicator to `left_p`
                mxx::comm subcomm = sc.split(left_p);

                // sample sort the bucket with arbitrary distribution
                mxx::sort(border_bucket.begin(), border_bucket.end(), subcomm);

#ifndef NDEBUG
                index_t first_bucket = border_bucket[0].B1;
#endif
                // rebucket with global offset of first -> in tuple form (also updates LCP)
                rebucket_tuples(border_bucket, subcomm, rebucket_offset, minqueries);
                // assert first bucket index remains the same
                assert(subcomm.rank() != 0 || first_bucket == border_bucket[0].B1);

                // save into full array (if this was left -> save to beginning)
                // (else, need offset of last)
                assert(bucket_offset == 0 || local_B[bucket_offset-1] < border_bucket[0].B1);
                assert(bucket_offset+border_bucket.size() <= local_size);
                for (std::size_t i = 0; i < border_bucket.size(); ++i) {
                    local_SA[i+bucket_offset] = border_bucket[i].SA;
                    local_B[i+bucket_offset] = border_bucket[i].B1;
                }
                assert(bucket_offset+border_bucket.size() == local_size || (local_B[bucket_offset+border_bucket.size()] > local_B[bucket_offset+border_bucket.size()-1]));
                assert(subcomm.rank() != 0 || local_B[bucket_offset] == bucket_offset+prefix+1);

                /*
                 * LCP update
                 */
                // LCP is updated in the custom `rebucket_tuples` function
            });

            comm.barrier();
        }


        // get new bucket number to the right
        right_B = mxx::left_shift(local_B[0], comm);
        // check if right bucket still goes over boundary
        right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

        // remember all the remaining active elements
        active_elements.clear();
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            index_t j = it->second - prefix;
            index_t i = it->second;
            // check if this is a unresolved bucket
            // relying on the property that for resolved buckets:
            //   B[i] == i+1 and B[i+1] == i+2
            //   (where `i' is the global index)
            if (local_B[j] != i+1 || (local_B[j] == i+1
                        && ((j < local_size-1 && local_B[j+1] == i+1)
                            || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
            {
                // save local active indexes
                active_elements.push_back(j);
            }
        }

        /*
         * 4.1)   Update LCP
         */
        if (_CONSTRUCT_LCP) {
            // time LCP separately!
            SAC_TIMER_START();
            // get parallel-distributed RMQ for all queries, results are in
            // `minqueries`
            // TODO: bulk updatable RMQs [such that we don't have to construct the
            //       RMQ for the local_LCP in each iteration]
            bulk_rmq(n, local_LCP, minqueries, comm);

            // update the new LCP values:
            for (auto min_lcp : minqueries) {
                local_LCP[std::get<0>(min_lcp) - prefix] = shift_by + std::get<2>(min_lcp);
            }
            SAC_TIMER_END_SECTION("LCP update");
        }

        /*
         * 4.2)  Update ISA
         */
        // message new bucket numbers to new SA[i] for all previously unfinished
        // buckets
        // since the message array is still available with the indices of unfinished
        // buckets -> reuse that information => no need to rescan the whole
        // local array
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_SA[it->second - prefix]; // SA[i]
            it->second = local_B[it->second - prefix]; // B[i]
        }

        // message exchange to processor which contains first index
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // update local ISA with new bucket numbers
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            local_ISA[it->first-prefix] = it->second;
        }
        SAC_TIMER_END_SECTION("bucket-chaising iteration");
    }
}